

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

void __thiscall inja::Environment::set_expression(Environment *this,string *open,string *close)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *close_local;
  string *open_local;
  Environment *this_local;
  
  local_20 = close;
  close_local = open;
  open_local = (string *)this;
  ::std::__cxx11::string::operator=((string *)&(this->lexer_config).expression_open,(string *)open);
  ::std::operator+(&local_40,close_local,"-");
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).expression_open_force_lstrip,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).expression_close,(string *)local_20);
  ::std::operator+(&local_60,"-",local_20);
  ::std::__cxx11::string::operator=
            ((string *)&(this->lexer_config).expression_close_force_rstrip,(string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  LexerConfig::update_open_chars(&this->lexer_config);
  return;
}

Assistant:

void set_expression(const std::string& open, const std::string& close) {
    lexer_config.expression_open = open;
    lexer_config.expression_open_force_lstrip = open + "-";
    lexer_config.expression_close = close;
    lexer_config.expression_close_force_rstrip = "-" + close;
    lexer_config.update_open_chars();
  }